

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

uint32 __thiscall
Clasp::LoopFormula::isOpen(LoopFormula *this,Solver *s,TypeSet *xs,LitVec *freeLits)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint32 uVar4;
  ulong uVar5;
  Literal *pLVar6;
  long lVar7;
  
  uVar4 = 0;
  if (((xs->m & 4) != 0) && (bVar2 = otherIsSat(this,s), !bVar2)) {
    uVar5 = (ulong)(*(uint *)&this->field_0x10 >> 0x1f);
    pLVar6 = (Literal *)((long)&this[1].super_Constraint._vptr_Constraint + uVar5 * 4 + 4);
    uVar5 = uVar5 * 4;
    while( true ) {
      uVar5 = uVar5 + 4;
      uVar1 = pLVar6->rep_;
      if (uVar1 < 4) break;
      bVar3 = *(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) & 3;
      if (bVar3 == 0) {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (freeLits,pLVar6);
      }
      else if (bVar3 == (byte)(2U - ((uVar1 & 2) == 0))) {
        this->other_ = (uint32)(uVar5 >> 2);
        return 0;
      }
      pLVar6 = pLVar6 + 1;
    }
    lVar7 = (ulong)(uint)(*(int *)&this->field_0x10 << 2) + (ulong)this->end_ * -4;
    pLVar6 = (Literal *)
             ((long)&this[1].super_Constraint._vptr_Constraint + (ulong)this->end_ * 4 + 4);
    uVar4 = 2;
    while (lVar7 = lVar7 + -4, lVar7 != 0) {
      if ((*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(pLVar6->rep_ & 0xfffffffc)) & 3)
          == 0) {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (freeLits,pLVar6);
      }
      pLVar6 = pLVar6 + 1;
    }
  }
  return uVar4;
}

Assistant:

uint32 LoopFormula::isOpen(const Solver& s, const TypeSet& xs, LitVec& freeLits) {
	if (!xs.inSet(Constraint_t::Loop) || otherIsSat(s)) {
		return 0;
	}
	for (Literal* it = begin() + xPos_; !isSentinel(*it); ++it) {
		if      (s.value(it->var()) == value_free) { freeLits.push_back(*it); }
		else if (s.isTrue(*it))                    { other_ = static_cast<uint32>(it-lits_); return 0; }
	}
	for (Literal* it = xBegin(), *end = xEnd(); it != end; ++it) {
		if (s.value(it->var()) == value_free) { freeLits.push_back(*it); }
	}
	return Constraint_t::Loop;
}